

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context_conflict *pk)

{
  int iVar1;
  uchar *end_00;
  mbedtls_pk_info_t *info;
  mbedtls_pk_info_t *pk_info;
  mbedtls_ecp_group_id ec_grp_id;
  mbedtls_pk_type_t pk_alg;
  mbedtls_asn1_buf alg_params;
  size_t len;
  int ret;
  mbedtls_pk_context_conflict *pk_local;
  uchar *end_local;
  uchar **p_local;
  
  pk_info._4_4_ = MBEDTLS_PK_NONE;
  pk_info._0_4_ = 0;
  iVar1 = mbedtls_asn1_get_tag(p,end,(size_t *)&alg_params.p,0x30);
  if (iVar1 == 0) {
    end_00 = *p + (long)alg_params.p;
    p_local._4_4_ =
         pk_get_pk_alg(p,end_00,(mbedtls_pk_type_t *)((long)&pk_info + 4),
                       (mbedtls_asn1_buf *)&ec_grp_id,(mbedtls_ecp_group_id *)&pk_info);
    if (p_local._4_4_ == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null(p,end_00,(size_t *)&alg_params.p);
      if (iVar1 == 0) {
        if (*p + (long)alg_params.p == end_00) {
          info = mbedtls_pk_info_from_type(pk_info._4_4_);
          if (info == (mbedtls_pk_info_t *)0x0) {
            p_local._4_4_ = -0x3c80;
          }
          else {
            p_local._4_4_ = mbedtls_pk_setup(pk,info);
            if (p_local._4_4_ == 0) {
              if ((pk_info._4_4_ == MBEDTLS_PK_ECKEY_DH) || (pk_info._4_4_ == MBEDTLS_PK_ECKEY)) {
                len._4_4_ = pk_use_ecparams((mbedtls_asn1_buf *)&ec_grp_id,pk);
                if (len._4_4_ == 0) {
                  len._4_4_ = pk_get_ecpubkey(p,end_00,pk);
                }
              }
              else {
                len._4_4_ = -0x3c80;
              }
              if ((len._4_4_ == 0) && (*p != end_00)) {
                len._4_4_ = mbedtls_error_add(-0x3b00,-0x66,
                                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                              ,0x3af);
              }
              if (len._4_4_ != 0) {
                mbedtls_pk_free(pk);
              }
              p_local._4_4_ = len._4_4_;
            }
          }
        }
        else {
          p_local._4_4_ =
               mbedtls_error_add(-0x3b00,-0x66,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                 ,0x38c);
        }
      }
      else {
        p_local._4_4_ =
             mbedtls_error_add(-0x3b00,iVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                               ,0x387);
      }
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x3d00,iVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                           ,0x37d);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_pk_parse_subpubkey(unsigned char **p, const unsigned char *end,
                               mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    mbedtls_ecp_group_id ec_grp_id = MBEDTLS_ECP_DP_NONE;
    const mbedtls_pk_info_t *pk_info;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = *p + len;

    if ((ret = pk_get_pk_alg(p, end, &pk_alg, &alg_params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_bitstring_null(p, end, &len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        ret = pk_get_rsapubkey(p, end, mbedtls_pk_rsa(*pk));
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            ret = pk_use_ecparams_rfc8410(&alg_params, ec_grp_id, pk);
        } else
#endif
        {
            ret = pk_use_ecparams(&alg_params, pk);
        }
        if (ret == 0) {
            ret = pk_get_ecpubkey(p, end, pk);
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if (ret == 0 && *p != end) {
        ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if (ret != 0) {
        mbedtls_pk_free(pk);
    }

    return ret;
}